

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O3

void __thiscall
fasttext::ProductQuantizer::kmeans(ProductQuantizer *this,real *x,real *c,int32_t n,int32_t d)

{
  ProductQuantizer *pPVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint n_00;
  long lVar5;
  uint8_t *code;
  real *prVar6;
  real *prVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  vector<unsigned_char,_std::allocator<unsigned_char>_> codes;
  vector<int,_std::allocator<int>_> perm;
  allocator_type local_99;
  ProductQuantizer *local_98;
  uint local_8c;
  long local_88;
  real *local_80;
  size_type local_78;
  real *local_70;
  int *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_78 = (size_type)n;
  local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  local_80 = c;
  local_70 = x;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,local_78,(value_type_conflict1 *)&local_60,&local_99);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    auVar8 = vpmovsxbd_avx512f(_DAT_0012b700);
    auVar9 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar11 = vpbroadcastd_avx512f(ZEXT416(0x10));
    uVar4 = 0;
    auVar12 = vpbroadcastq_avx512f();
    auVar12 = vpsrlq_avx512f(auVar12,2);
    do {
      auVar13 = vpbroadcastq_avx512f();
      auVar14 = vporq_avx512f(auVar13,auVar9);
      auVar13 = vporq_avx512f(auVar13,auVar10);
      vpcmpuq_avx512f(auVar13,auVar12,2);
      vpcmpuq_avx512f(auVar14,auVar12,2);
      auVar13 = vmovdqu32_avx512f(auVar8);
      *(undefined1 (*) [64])
       (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start + uVar4) = auVar13;
      uVar4 = uVar4 + 0x10;
      auVar8 = vpaddd_avx512f(auVar8,auVar11);
    } while ((((ulong)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish +
                      (-4 - (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start)) >> 2) + 0x10 &
             0xfffffffffffffff0) != uVar4);
  }
  local_8c = n;
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>&>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,&this->rng);
  prVar6 = local_70;
  lVar3 = (long)d;
  local_88 = lVar3;
  if (0 < this->ksub_) {
    lVar5 = 0;
    local_68 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    prVar7 = local_80;
    local_98 = (ProductQuantizer *)(lVar3 * 4);
    do {
      memcpy(prVar7,prVar6 + local_68[lVar5] * local_88,lVar3 * 4);
      lVar5 = lVar5 + 1;
      prVar7 = prVar7 + lVar3;
    } while (lVar5 < this->ksub_);
  }
  local_98 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_60,local_78,(allocator_type *)&local_99);
  if (0 < local_98->niter_) {
    local_88 = local_88 << 2;
    local_78 = (size_type)local_8c;
    iVar2 = 0;
    prVar6 = local_70;
    prVar7 = local_80;
    n_00 = local_8c;
    do {
      lVar3 = local_88;
      pPVar1 = local_98;
      code = (uint8_t *)
             CONCAT44(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                      local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_4_);
      local_68 = (int *)CONCAT44(local_68._4_4_,iVar2);
      uVar4 = local_78;
      if (0 < (int)n_00) {
        do {
          assign_centroid(pPVar1,prVar6,local_80,code,d);
          code = code + 1;
          prVar6 = (real *)((long)prVar6 + lVar3);
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
        code = (uint8_t *)
               CONCAT44(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_4_);
        prVar6 = local_70;
        prVar7 = local_80;
        n_00 = local_8c;
      }
      pPVar1 = local_98;
      MStep(local_98,prVar6,prVar7,code,d,n_00);
      iVar2 = (int)local_68 + 1;
    } while (iVar2 < pPVar1->niter_);
  }
  if ((void *)CONCAT44(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_60.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_60.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProductQuantizer::kmeans(const real* x, real* c, int32_t n, int32_t d) {
  std::vector<int32_t> perm(n, 0);
  std::iota(perm.begin(), perm.end(), 0);
  std::shuffle(perm.begin(), perm.end(), rng);
  for (auto i = 0; i < ksub_; i++) {
    memcpy(&c[i * d], x + perm[i] * d, d * sizeof(real));
  }
  auto codes = std::vector<uint8_t>(n);
  for (auto i = 0; i < niter_; i++) {
    Estep(x, c, codes.data(), d, n);
    MStep(x, c, codes.data(), d, n);
  }
}